

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zm.c
# Opt level: O0

void zmCreate(qr_o *r,octet *mod,size_t no,void *stack)

{
  bool_t bVar1;
  void *in_RDX;
  byte *in_RSI;
  octet *in_RDI;
  qr_o *unaff_retaddr;
  
  if (in_RDX < (void *)0x11) {
    zmCreatePlain(unaff_retaddr,in_RDI,(size_t)in_RSI,in_RDX);
  }
  else if ((((((ulong)in_RDX & 7) == 0) && ((void *)0xf < in_RDX)) &&
           (bVar1 = memIsZero(in_RSI,8), bVar1 == 0)) &&
          (bVar1 = memIsRep(in_RSI + 8,(long)in_RDX - 8,0xff), bVar1 != 0)) {
    zmCreateCrand(unaff_retaddr,in_RDI,(size_t)in_RSI,in_RDX);
  }
  else if ((uint)*in_RSI % 2 == 0) {
    if (in_RDX < (void *)0x20) {
      zmCreatePlain(unaff_retaddr,in_RDI,(size_t)in_RSI,in_RDX);
    }
    else {
      zmCreateBarr(unaff_retaddr,in_RDI,(size_t)in_RSI,in_RDX);
    }
  }
  else {
    zmCreateMont(r,mod,no,stack);
  }
  return;
}

Assistant:

void zmCreate(qr_o* r, const octet mod[], size_t no, void* stack)
{
	ASSERT(memIsValid(r, sizeof(qr_o)));
	ASSERT(memIsValid(mod, no));
	ASSERT(no > 0 && mod[no - 1] > 0);
	// короткий модуль?
	if (no <= 2 * O_PER_W)
		zmCreatePlain(r, mod, no, stack);
	// подходит редукция Крэндалла?
	else if (no % O_PER_W == 0 && no >= 2 * O_PER_W &&
		!memIsZero(mod, O_PER_W) &&
		memIsRep(mod + O_PER_W, no - O_PER_W, 0xFF))
		zmCreateCrand(r, mod, no, stack);
	// подходит редукция Монтгомери?
	else if (mod[0] % 2)
		zmCreateMont(r, mod, no, stack);
	// длинный модуль?
	else if (no >= 4 * O_PER_W)
		zmCreateBarr(r, mod, no, stack);
	// средний четный модуль
	else
		zmCreatePlain(r, mod, no, stack);
}